

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O1

void GetFrameDesc(Frame *f,DisplayBase display_base,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *results,USBStringContainer *stringDescriptors)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  U64 i;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  size_type *psVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  int max_bits;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  switch(f[0x20]) {
  case (Frame)0x0:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity =
         local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (*(ulong *)(f + 0x10) < 4) {
      std::__cxx11::string::operator=
                ((string *)&local_d0,*(char **)(&DAT_0015a5f8 + *(ulong *)(f + 0x10) * 8));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_d0);
    goto LAB_0012fc58;
  case (Frame)0x1:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SYNC","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    break;
  case (Frame)0x2:
    GetPIDName_abi_cxx11_(&local_b0,*(USB_PID *)(f + 0x10));
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x13bd1d);
    puVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    GetPIDName_abi_cxx11_(&local_d0,*(USB_PID *)(f + 0x10));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    goto LAB_0012fc58;
  case (Frame)0x3:
    int2str_sal_abi_cxx11_(&local_b0,*(U64 *)(f + 0x10),display_base,0xb);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x13bd22);
    paVar1 = &local_d0.field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = plVar3[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_b0,*(U64 *)(f + 0x10),display_base,0xb);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x13bd2b);
    puVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Frame #","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_d0,*(U64 *)(f + 0x10),display_base,0xb);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    _Var8._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar1) {
      return;
    }
    goto LAB_0012faac;
  case (Frame)0x4:
    int2str_sal_abi_cxx11_(&local_50,*(U64 *)(f + 0x10),display_base,7);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13a8c5);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_b0.field_2;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_90,*(U64 *)(f + 0x18),display_base,5);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      uVar7 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar7 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) goto LAB_0012fd85;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_0012fd85:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = puVar4[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)psVar6 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    paVar2 = &local_d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_50,*(U64 *)(f + 0x10),display_base,7);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13bd38);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_90,*(U64 *)(f + 0x18),display_base,5);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      uVar7 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar7 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) goto LAB_00130197;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_00130197:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)psVar6 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_50,*(U64 *)(f + 0x10),display_base,7);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13bd45);
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = puVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_70._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_90,*(U64 *)(f + 0x18),display_base,5);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      uVar7 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar7 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) goto LAB_00130552;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_00130552:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)psVar6 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_70,*(U64 *)(f + 0x10),display_base,7);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    puVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0.field_2._8_8_ = puVar4[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar5;
      local_b0._M_dataplus._M_p = (pointer)*puVar4;
    }
    paVar9 = &local_70.field_2;
    local_b0._M_string_length = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_50,*(U64 *)(f + 0x18),display_base,5);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      uVar7 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_50._M_string_length + local_b0._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar7 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_50._M_string_length + local_b0._M_string_length) goto LAB_001306f3;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_001306f3:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
    }
    puVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)puVar5 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    _Var8._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
      _Var8._M_p = local_70._M_dataplus._M_p;
    }
    goto LAB_001307a7;
  case (Frame)0x5:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"EOP","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    break;
  case (Frame)0x6:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Reset","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    break;
  case (Frame)0x7:
  case (Frame)0x8:
    max_bits = 0x10;
    if (f[0x20] == (Frame)0x7) {
      max_bits = 5;
    }
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CRC","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    i = *(U64 *)(f + 0x10);
    if (i == *(U64 *)(f + 0x18)) {
      int2str_sal_abi_cxx11_(&local_b0,i,display_base,max_bits);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x13bd60);
      puVar5 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_d0.field_2._M_allocated_capacity = *puVar5;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar5;
        local_d0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CRC OK","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_d0);
    }
    else {
      int2str_sal_abi_cxx11_(&local_50,i,display_base,max_bits);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13bd6f);
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70.field_2._8_8_ = puVar4[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar6;
        local_70._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_70._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      puVar5 = (ulong *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_b0.field_2._M_allocated_capacity = *puVar5;
        local_b0.field_2._8_8_ = plVar3[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar5;
        local_b0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_b0._M_string_length = plVar3[1];
      *plVar3 = (long)puVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      int2str_sal_abi_cxx11_(&local_90,*(U64 *)(f + 0x18),display_base,max_bits);
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar7 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar7 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_90._M_string_length + local_b0._M_string_length) goto LAB_0012ff9d;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_0012ff9d:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p)
        ;
      }
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0.field_2._8_8_ = puVar4[3];
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_d0._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)psVar6 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      int2str_sal_abi_cxx11_(&local_b0,*(U64 *)(f + 0x10),display_base,max_bits);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x13bd6f);
      puVar5 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_d0.field_2._M_allocated_capacity = *puVar5;
        local_d0.field_2._8_8_ = puVar4[3];
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar5;
        local_d0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_d0._M_string_length = puVar4[1];
      *puVar4 = puVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CRC Bad","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_d0,*(U64 *)(f + 0x10),display_base,max_bits);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    _Var8._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar1) {
      return;
    }
    goto LAB_0012faac;
  case (Frame)0x9:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Idle","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    break;
  case (Frame)0xa:
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Keep alive","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"KA","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    break;
  case (Frame)0xb:
    int2str_sal_abi_cxx11_(&local_b0,*(U64 *)(f + 0x10),display_base,8);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x13bd4c);
    puVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *puVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    int2str_sal_abi_cxx11_(&local_d0,*(U64 *)(f + 0x10),display_base,8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
LAB_0012fc58:
    paVar9 = &local_d0.field_2;
    _Var8._M_p = local_d0._M_dataplus._M_p;
LAB_001307a7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p == paVar9) {
      return;
    }
    goto LAB_0012faac;
  case (Frame)0xc:
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Error packet","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Error","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Err","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"E","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_d0);
    break;
  case (Frame)0xd:
    GetCtrlTransFrameDesc(f,display_base,results,stringDescriptors);
    return;
  case (Frame)0xe:
    GetHIDReportDescriptorItemFrameDesc(f,display_base,results);
    return;
  default:
    goto switchD_0012f5e8_default;
  }
  _Var8._M_p = local_d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
LAB_0012faac:
    operator_delete(_Var8._M_p);
  }
switchD_0012f5e8_default:
  return;
}

Assistant:

void GetFrameDesc( const Frame& f, DisplayBase display_base, std::vector<std::string>& results,
                   const USBAnalyzerResults::USBStringContainer& stringDescriptors )
{
    results.clear();

    if( f.mType == FT_Signal )
    {
        std::string result;
        if( f.mData1 == S_J )
            result = "J";
        else if( f.mData1 == S_K )
            result = "K";
        else if( f.mData1 == S_SE0 )
            result = "SE0";
        else if( f.mData1 == S_SE1 )
            result = "SE1";

        results.push_back( result );
    }
    else if( f.mType == FT_EOP )
    {
        results.push_back( "EOP" );
    }
    else if( f.mType == FT_Reset )
    {
        results.push_back( "Reset" );
    }
    else if( f.mType == FT_Idle )
    {
        results.push_back( "Idle" );
    }
    else if( f.mType == FT_SYNC )
    {
        results.push_back( "SYNC" );
    }
    else if( f.mType == FT_PID )
    {
        results.push_back( "PID " + GetPIDName( USB_PID( f.mData1 ) ) );
        results.push_back( GetPIDName( USB_PID( f.mData1 ) ) );
    }
    else if( f.mType == FT_FrameNum )
    {
        results.push_back( "Frame # " + int2str_sal( f.mData1, display_base, 11 ) );
        results.push_back( "F # " + int2str_sal( f.mData1, display_base, 11 ) );
        results.push_back( "Frame #" );
        results.push_back( int2str_sal( f.mData1, display_base, 11 ) );
    }
    else if( f.mType == FT_AddrEndp )
    {
        results.push_back( "Address=" + int2str_sal( f.mData1, display_base, 7 ) +
                           " Endpoint=" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( "Addr=" + int2str_sal( f.mData1, display_base, 7 ) + " Endp=" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( "A:" + int2str_sal( f.mData1, display_base, 7 ) + " E:" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( int2str_sal( f.mData1, display_base, 7 ) + " " + int2str_sal( f.mData2, display_base, 5 ) );
    }
    else if( f.mType == FT_Byte )
    {
        results.push_back( "Byte " + int2str_sal( f.mData1, display_base, 8 ) );
        results.push_back( int2str_sal( f.mData1, display_base, 8 ) );
    }
    else if( f.mType == FT_KeepAlive )
    {
        results.push_back( "Keep alive" );
        results.push_back( "KA" );
    }
    else if( f.mType == FT_CRC5 || f.mType == FT_CRC16 )
    {
        const int num_bits = f.mType == FT_CRC5 ? 5 : 16;
        results.push_back( "CRC" );
        if( f.mData1 == f.mData2 )
        {
            results.push_back( "CRC OK " + int2str_sal( f.mData1, display_base, num_bits ) );
            results.push_back( "CRC OK" );
        }
        else
        {
            results.push_back( "CRC Bad! Rcvd: " + int2str_sal( f.mData1, display_base, num_bits ) +
                               " Calc: " + int2str_sal( f.mData2, display_base, num_bits ) );
            results.push_back( "CRC Bad! Rcvd: " + int2str_sal( f.mData1, display_base, num_bits ) );
            results.push_back( "CRC Bad" );
        }

        results.push_back( int2str_sal( f.mData1, display_base, num_bits ) );
    }
    else if( f.mType == FT_Error )
    {
        results.push_back( "Error packet" );
        results.push_back( "Error" );
        results.push_back( "Err" );
        results.push_back( "E" );
    }
    else if( f.mType == FT_ControlTransferField )
    {
        GetCtrlTransFrameDesc( f, display_base, results, stringDescriptors );
    }
    else if( f.mType == FT_HIDReportDescriptorItem )
    {
        GetHIDReportDescriptorItemFrameDesc( f, display_base, results );
    }
}